

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PropertyExprSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x169) {
    if ((int)kind < 0xd1) {
      if (((CasePropertyExpr < kind) || ((0x4000000000002010U >> ((ulong)kind & 0x3f) & 1) == 0)) &&
         ((kind != ClockingPropertyExpr && (kind != ConditionalPropertyExpr)))) {
        return false;
      }
    }
    else if (((0x27 < kind - FollowedByPropertyExpr) ||
             ((0x8408000001U >> ((ulong)(kind - FollowedByPropertyExpr) & 0x3f) & 1) == 0)) &&
            (kind != OrPropertyExpr)) {
      return false;
    }
  }
  else if ((((0x1f < kind - SUntilPropertyExpr) ||
            ((0x80010003U >> (kind - SUntilPropertyExpr & 0x1f) & 1) == 0)) &&
           ((10 < kind - UnaryPropertyExpr ||
            ((0x603U >> (kind - UnaryPropertyExpr & 0x1f) & 1) == 0)))) &&
          (kind != ParenthesizedPropertyExpr)) {
    return false;
  }
  return true;
}

Assistant:

bool PropertyExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AcceptOnPropertyExpr:
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::CasePropertyExpr:
        case SyntaxKind::ClockingPropertyExpr:
        case SyntaxKind::ConditionalPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::ParenthesizedPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::SimplePropertyExpr:
        case SyntaxKind::StrongWeakPropertyExpr:
        case SyntaxKind::UnaryPropertyExpr:
        case SyntaxKind::UnarySelectPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
            return true;
        default:
            return false;
    }
}